

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O3

bool ON_Locale::ParseName
               (char *locale_name,int locale_name_element_count,char *language_code,
               size_t language_code_capacity,char *extlang_code,size_t extlang_code_capacity,
               char *script_code,size_t script_code_capacity,char *region_code,
               size_t region_code_capacity,char *sortorder,size_t sortorder_capacity)

{
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  char cVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  byte *pbVar19;
  uint uVar20;
  byte *pbVar21;
  byte *pbVar22;
  byte bVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  ulong local_90;
  char *local_88;
  byte *local_78;
  byte *local_58;
  
  bVar25 = language_code_capacity != 0;
  local_88 = (char *)0x0;
  local_90 = 0;
  if (language_code != (char *)0x0 && bVar25) {
    memset(language_code,0,language_code_capacity);
    local_90 = language_code_capacity;
    local_88 = language_code;
  }
  bVar26 = extlang_code_capacity != 0;
  local_58 = (byte *)0x0;
  uVar10 = 0;
  if (extlang_code != (char *)0x0 && bVar26) {
    memset(extlang_code,0,extlang_code_capacity);
    uVar10 = extlang_code_capacity;
    local_58 = (byte *)extlang_code;
  }
  bVar27 = script_code_capacity != 0;
  local_78 = (byte *)0x0;
  pbVar11 = (byte *)0x0;
  if (script_code != (char *)0x0 && bVar27) {
    memset(script_code,0,script_code_capacity);
    local_78 = (byte *)script_code;
    pbVar11 = (byte *)script_code_capacity;
  }
  bVar28 = region_code_capacity != 0;
  uVar12 = 0;
  pbVar21 = (byte *)0x0;
  if (region_code != (char *)0x0 && bVar28) {
    memset(region_code,0,region_code_capacity);
    uVar12 = region_code_capacity;
    pbVar21 = (byte *)region_code;
  }
  bVar29 = sortorder_capacity != 0;
  pcVar16 = (char *)0x0;
  uVar24 = 0;
  if (sortorder != (char *)0x0 && bVar29) {
    memset(sortorder,0,sortorder_capacity);
    pcVar16 = sortorder;
    uVar24 = sortorder_capacity;
  }
  if (((((language_code != (char *)0x0 && bVar25 || !bVar25) &&
        (extlang_code != (char *)0x0 && bVar26 || !bVar26)) &&
       (script_code != (char *)0x0 && bVar27 || !bVar27)) &&
      (region_code != (char *)0x0 && bVar28 || !bVar28)) &&
      (sortorder != (char *)0x0 && bVar29 || !bVar29)) {
    bVar23 = 1;
    if (((locale_name == (char *)0x0) || (locale_name_element_count == 0)) || (*locale_name == '\0')
       ) goto LAB_004cd289;
    if (locale_name_element_count < 0) {
      locale_name_element_count = ON_String::Length(locale_name);
    }
    if (1 < locale_name_element_count) {
      pbVar19 = (byte *)(locale_name + -1);
      lVar13 = -1;
      do {
        pbVar22 = pbVar19 + 1;
        pbVar19 = pbVar19 + 1;
        lVar13 = lVar13 + 1;
      } while ((byte)((*pbVar22 & 0xdf) + 0xbf) < 0x1a);
      if (1 < lVar13) {
        if (locale_name < pbVar19 && local_90 != 0) {
          uVar14 = 1;
          do {
            cVar3 = locale_name[uVar14 - 1];
            cVar15 = cVar3 + ' ';
            if (0x19 < (byte)(cVar3 + 0xbfU)) {
              cVar15 = cVar3;
            }
            local_88[uVar14 - 1] = cVar15;
          } while ((uVar14 < local_90) &&
                  (pbVar22 = (byte *)(locale_name + uVar14), uVar14 = uVar14 + 1, pbVar22 < pbVar19)
                  );
        }
        if ((*local_88 != '\0') && (local_88[1] != '\0')) {
          pbVar22 = (byte *)(locale_name + (uint)locale_name_element_count);
          if (pbVar19 < pbVar22) {
            bVar6 = 1;
            uVar20 = 0;
            bVar4 = 1;
            bVar25 = true;
            bVar7 = 1;
            bVar8 = 1;
            do {
              bVar23 = *pbVar19;
              if (bVar23 == 0) {
                bVar23 = 0;
                bVar6 = 1;
                break;
              }
              if (((bVar23 != 0x5f) && (bVar23 != 0x2d)) ||
                 (pbVar1 = pbVar19 + 1, pbVar22 <= pbVar1)) {
LAB_004cd2d1:
                bVar23 = 0;
                bVar6 = 0;
                break;
              }
              lVar13 = 1;
              do {
                if (((pbVar19[lVar13] & 0xfe) != 0x30) &&
                   (lVar17 = lVar13, 0x19 < (byte)((pbVar19[lVar13] & 0xdf) + 0xbf))) break;
                lVar5 = lVar13 + 1;
                lVar13 = lVar13 + 1;
                lVar17 = (long)pbVar22 - (long)pbVar19;
              } while (pbVar19 + lVar5 < pbVar22);
              if (lVar17 < 3) goto LAB_004cd2d1;
              pbVar2 = pbVar19 + lVar17;
              uVar14 = lVar17 - 1;
              if (((((bool)(bVar7 & bVar23 == 0x2d & uVar14 == 3)) &&
                   ((byte)((*pbVar1 & 0xdf) + 0xbf) < 0x1a)) &&
                  ((byte)((pbVar19[2] & 0xdf) + 0xbf) < 0x1a)) &&
                 (bVar7 = (pbVar19[3] & 0xdf) + 0xbf, bVar7 < 0x1a)) {
                if (uVar10 - 1 < 2) goto LAB_004cd2d1;
                pbVar9 = (byte *)(ulong)bVar7;
                if (uVar10 != 0) {
                  uVar14 = 1;
                  do {
                    bVar23 = pbVar19[uVar14];
                    bVar7 = bVar23 + 0x20;
                    if (0x19 < (byte)(bVar23 + 0xbf)) {
                      bVar7 = bVar23;
                    }
                    local_58[uVar14 - 1] = bVar7;
                    pbVar9 = local_58;
                    if (uVar10 <= uVar14) break;
                    pbVar9 = pbVar19 + uVar14 + 1;
                    uVar14 = uVar14 + 1;
                  } while (pbVar9 < pbVar2);
                }
              }
              else {
                if (((!(bool)(bVar8 & bVar23 == 0x2d & uVar14 == 4)) ||
                    (bVar8 = *pbVar1, 0x19 < (byte)((bVar8 & 0xdf) + 0xbf))) ||
                   ((0x19 < (byte)((pbVar19[2] & 0xdf) + 0xbf) ||
                    ((0x19 < (byte)((pbVar19[3] & 0xdf) + 0xbf) ||
                     (bVar7 = (pbVar19[4] & 0xdf) + 0xbf, pbVar9 = (byte *)(ulong)bVar7,
                     0x19 < bVar7)))))) {
                  uVar18 = uVar14;
                  if (bVar25) {
                    if (bVar23 != 0x2d) {
                      if ((bVar23 == 0x5f) && (uVar14 == 2)) {
LAB_004cd163:
                        uVar18 = 2;
                        if (((byte)((*pbVar1 & 0xdf) + 0xbf) < 0x1a) &&
                           (bVar8 = (pbVar19[2] & 0xdf) + 0xbf, pbVar9 = (byte *)(ulong)bVar8,
                           bVar8 < 0x1a)) {
LAB_004cd20e:
                          if (uVar12 - 1 < uVar14) goto LAB_004cd2d1;
                          if (uVar12 != 0) {
                            uVar14 = 1;
                            do {
                              bVar23 = pbVar19[uVar14];
                              bVar8 = bVar23 - 0x20;
                              if (0x19 < (byte)(bVar23 + 0x9f)) {
                                bVar8 = bVar23;
                              }
                              pbVar21[uVar14 - 1] = bVar8;
                              pbVar9 = pbVar21;
                              if (uVar12 <= uVar14) break;
                              pbVar9 = pbVar19 + uVar14 + 1;
                              uVar14 = uVar14 + 1;
                            } while (pbVar9 < pbVar2);
                          }
                          bVar8 = 0;
                          bVar25 = false;
                          goto LAB_004cd264;
                        }
                      }
                      goto LAB_004cd185;
                    }
                    if (lVar17 == 4) {
                      if ((((*pbVar1 & 0xfe) == 0x30) && ((pbVar19[2] & 0xfe) == 0x30)) &&
                         (pbVar9 = (byte *)((ulong)pbVar19[3] & 0xfffffffffffffffe),
                         (char)pbVar9 == '0')) goto LAB_004cd20e;
                    }
                    else if (lVar17 == 3) goto LAB_004cd163;
                  }
                  else {
LAB_004cd185:
                    bVar23 = bVar23 != 0x5f;
                    if (!(bool)(~bVar4 & 1 | bVar23)) {
                      if (uVar24 - 1 < uVar18) goto LAB_004cd2d1;
                      if (uVar24 == 0) {
LAB_004cd1e1:
                        pbVar9 = (byte *)(ulong)bVar23;
                        bVar8 = 0;
                        bVar25 = false;
                        bVar4 = 0;
                      }
                      else {
                        uVar14 = 1;
                        do {
                          bVar23 = pbVar19[uVar14];
                          pcVar16[uVar14 - 1] = bVar23;
                          bVar8 = 0;
                          if (uVar24 <= uVar14) goto LAB_004cd1e1;
                          pbVar9 = pbVar19 + uVar14 + 1;
                          uVar14 = uVar14 + 1;
                          bVar25 = false;
                          bVar4 = 0;
                        } while (pbVar9 < pbVar2);
                      }
                      goto LAB_004cd264;
                    }
                  }
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                             ,0x310,"","Parser needs to be enhanced or input is not valid");
                  goto LAB_004cd2d1;
                }
                if (pbVar11 + -1 < (byte *)0x3) goto LAB_004cd2d1;
                if (pbVar11 == (byte *)0x0) {
                  bVar8 = 0;
                }
                else {
                  bVar23 = bVar8 - 0x20;
                  if (0x19 < (byte)(bVar8 + 0x9f)) {
                    bVar23 = bVar8;
                  }
                  *local_78 = bVar23;
                  lVar13 = 3;
                  do {
                    bVar23 = pbVar19[lVar13 + -1];
                    bVar8 = bVar23 + 0x20;
                    if (0x19 < (byte)(bVar23 + 0xbf)) {
                      bVar8 = bVar23;
                    }
                    local_78[lVar13 + -2] = bVar8;
                    pbVar9 = (byte *)(lVar13 - 1);
                    bVar8 = 0;
                    if (pbVar11 <= pbVar9) break;
                    pbVar9 = pbVar19 + lVar13;
                    lVar13 = lVar13 + 1;
                  } while (pbVar9 < pbVar2);
                }
              }
LAB_004cd264:
              locale_name_element_count = (int)pbVar9;
              bVar23 = 1;
              if (2 < uVar20) goto LAB_004cd2a2;
              uVar20 = uVar20 + 1;
              bVar7 = 0;
              pbVar19 = pbVar2;
            } while (pbVar2 < pbVar22);
          }
          else {
LAB_004cd2a2:
            bVar23 = 1;
            bVar6 = (byte)locale_name_element_count;
          }
          bVar23 = bVar23 | bVar6;
          goto LAB_004cd289;
        }
      }
    }
  }
  bVar23 = 0;
LAB_004cd289:
  return (bool)(bVar23 & 1);
}

Assistant:

bool ON_Locale::ParseName(
  const char* locale_name,
  int locale_name_element_count,
  char* language_code,
  size_t language_code_capacity,
  char* extlang_code,
  size_t extlang_code_capacity,
  char* script_code,
  size_t script_code_capacity,
  char* region_code,
  size_t region_code_capacity,
  char* sortorder,
  size_t sortorder_capacity
  )
{
  bool rc = true;

  if ( false == ZeroCharBuffer(language_code, language_code_capacity, sizeof(language_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(extlang_code, extlang_code_capacity, sizeof(extlang_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(script_code,   script_code_capacity,   sizeof(script_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(region_code,   region_code_capacity,   sizeof(region_code[0])) )
    rc = false;
  if ( false == ZeroCharBuffer(sortorder,     sortorder_capacity,     sizeof(sortorder[0])) )
    rc = false;

  if (!rc)
    return false;

  if ( nullptr == locale_name || 0 == locale_name[0] || 0 == locale_name_element_count )
    return true;

  if ( locale_name_element_count < 0 )
    locale_name_element_count = ON_String::Length(locale_name);

  if ( locale_name_element_count < 2 )
    return false;

  const char* locale_name_end = locale_name + locale_name_element_count;

  const char* s0 = locale_name;
  const char* s1 = s0;
  while( IsAlpha(*s1) )
    s1++;

  if ( s1-s0 < 2 )
    return false;

  for ( size_t i = 0; i < language_code_capacity && s0 < s1 ; i++)
    language_code[i] = ToLower(*s0++); // lower case for language code is a convention

  if ( 0 == language_code[0] || 0 == language_code[1] )
    return false;

  bool bScriptTest = true;
  bool bExtlangTest = true;
  bool bRegionTest = true;
  bool bSortOrderTest = true;

  for (int pass = 0; pass < 4 && s1 < locale_name_end; pass++)
  {
    char c0 = *s1;

    if (0 == c0)
      return true;

    if (false == IsHyphenOrUnderbar(c0))
      return false;

    s1++;
    s0 = s1;
    while (s1 < locale_name_end && IsAlphaOrDigit(*s1))
      s1++;

    if ( s1-s0 < 2 )
      return false;

    if (bExtlangTest)
    {
      bExtlangTest = false;
      if ( IsHyphen(c0)
        && 3 == s1 - s0
        && IsAlpha(s0[0])
        && IsAlpha(s0[1])
        && IsAlpha(s0[2])
        )
      {
        if ( extlang_code_capacity > 0 && extlang_code_capacity < (size_t)(s1-s0) )
          return false;
        if (extlang_code_capacity > 0)
        {
          for (size_t i = 0; i < extlang_code_capacity && s0 < s1; i++)
            extlang_code[i] = ToLower(*s0++); // lower case for extlang code is a convention
        }
        continue;
      }
    }

    if (bScriptTest)
    {
      bScriptTest = false;
      if ( IsHyphen(c0)
        && 4 == s1 - s0
        && IsAlpha(s0[0])
        && IsAlpha(s0[1])
        && IsAlpha(s0[2])
        && IsAlpha(s0[3])
        )
      {
        // ISO 15924 script code
        if ( script_code_capacity > 0 && script_code_capacity < (size_t)(s1-s0) )
          return false;
        if (script_code_capacity > 0)
        {
          // convention is for script codes is CAPITAL, small, small, small case
          script_code[0] = ToUpper(*s0++);
          for (size_t i = 1; i < script_code_capacity && s0 < s1; i++)
            script_code[i] = ToLower(*s0++);
        }
        continue;
      }
    }

    if (bRegionTest)
    {
      bRegionTest = false;
      // IsUnderbar(c0) is here to handle Apple OS X and iOS "locale id" names like "en_US" which use and underbar before region
      if (
        ( (IsHyphen(c0) || IsUnderbar(c0)) && 2 == s1 - s0 && IsAlpha(s0[0]) && IsAlpha(s0[1]) )  // ISO 3166 country/region identifier (2 alpha)
        || ( IsHyphen(c0) && 3 == s1 - s0 && IsDigit(s0[0]) && IsDigit(s0[1]) && IsDigit(s0[2]) ) // UN M.49 code (3 digits)
        )
      {
        if ( region_code_capacity > 0 && region_code_capacity <= (size_t)(s1-s0) )
          return false;
        for (size_t i = 0; i < region_code_capacity && s0 < s1; i++)
          region_code[i] = ToUpper(*s0++); // uppercase for regions is a convention
        continue;
      }
    }

    if (bSortOrderTest)
    {
      bSortOrderTest = false;
      if (IsUnderbar(c0))
      {
        // Windows sort order
        if (sortorder_capacity > 0 && sortorder_capacity <= (size_t)(s1 - s0))
          return false;
        for (size_t i = 0; i < sortorder_capacity && s0 < s1; i++)
          sortorder[i] = *s0++;
        continue;
      }
    }


    ON_ERROR("Parser needs to be enhanced or input is not valid");
    return false;
  }

  return true;

}